

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_ClassArray<ON_FontFaceQuartet> * __thiscall ON_FontList::QuartetList(ON_FontList *this)

{
  Member MVar1;
  ON_FontListImpl *pOVar2;
  long lVar3;
  ON_Font **ppOVar4;
  bool bVar5;
  undefined4 extraout_EAX;
  ulong uVar6;
  ON_Font *pOVar7;
  wchar_t *quartet_name_00;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  uint j;
  ON_wString *pOVar15;
  ulong uVar16;
  int iVar17;
  size_t new_capacity;
  ulong uVar18;
  long *plVar19;
  bool bVar20;
  ON_SimpleArray<const_ON_Font_*> *this_00;
  long lVar21;
  uint uVar22;
  ON_Font *pOVar23;
  int iVar24;
  undefined1 auVar25 [16];
  ON_3udex OVar26;
  ON_wString quartet_name;
  ON_FontFaceQuartet q;
  ON_SimpleArray<const_ON_Font_*> bolditalic_faces;
  ON_SimpleArray<const_ON_Font_*> italic_faces;
  ON_SimpleArray<const_ON_Font_*> bold_faces;
  ON_SimpleArray<const_ON_Font_*> regular_faces;
  ON_Font *upright_faces [2];
  ON_Font *slanted_faces [2];
  uint local_94c;
  ON_Font *local_948;
  ulong local_940;
  uint local_934;
  ON_Font *local_930;
  ON_Font *local_928;
  uint local_920;
  uint local_91c;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  ulong local_8f8;
  ON_wString local_8f0;
  ON_Font *local_8e8;
  ON_ClassArray<ON_FontFaceQuartet> *local_8e0;
  ulong local_8d8;
  ON_FontFaceQuartet local_8d0;
  undefined1 local_8a8 [8];
  undefined1 local_8a0 [16];
  undefined1 local_890 [8];
  undefined1 local_888 [16];
  undefined1 local_878 [8];
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  ulong local_828;
  ON_wString local_820;
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  long local_7c8 [4];
  long alStack_7a8 [19];
  long alStack_710 [220];
  
  Internal_UpdateSortedLists(this);
  local_8e0 = &this->m_quartet_list;
  if ((this->m_quartet_list).m_count < 1) {
    pOVar2 = this->m_sorted;
    uVar8 = (pOVar2->m_by_quartet_name).m_count;
    uVar16 = (ulong)uVar8;
    new_capacity = (ulong)(uVar8 >> 2) + 0x20;
    if ((uint)(this->m_quartet_list).m_capacity < (uint)new_capacity) {
      ON_ClassArray<ON_FontFaceQuartet>::SetCapacity(local_8e0,new_capacity);
    }
    local_948 = (ON_Font *)0x0;
    local_860 = (undefined1  [8])&PTR__ON_SimpleArray_0080f990;
    local_858 = (undefined1  [16])0x0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity((ON_SimpleArray<const_ON_Font_*> *)local_860,8);
    local_878 = (undefined1  [8])&PTR__ON_SimpleArray_0080f990;
    local_870 = (undefined1  [16])0x0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity((ON_SimpleArray<const_ON_Font_*> *)local_878,8);
    local_890 = (undefined1  [8])&PTR__ON_SimpleArray_0080f990;
    local_888 = (undefined1  [16])0x0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity((ON_SimpleArray<const_ON_Font_*> *)local_890,8);
    local_8a8 = (undefined1  [8])&PTR__ON_SimpleArray_0080f990;
    local_8a0 = (undefined1  [16])0x0;
    ON_SimpleArray<const_ON_Font_*>::SetCapacity((ON_SimpleArray<const_ON_Font_*> *)local_8a8,8);
    if (uVar16 != 0) {
      local_8f8 = 0;
      uVar18 = 0;
      local_828 = uVar16;
      do {
        pOVar23 = (pOVar2->m_by_quartet_name).m_a[uVar18];
        local_948 = pOVar23;
        if (pOVar23 != (ON_Font *)0x0) {
          local_8d8 = uVar18;
          bVar5 = ON_wString::IsNotEmpty(&pOVar23->m_loc_windows_logfont_name);
          pOVar15 = &pOVar23->m_en_windows_logfont_name;
          if (bVar5) {
            pOVar15 = &pOVar23->m_loc_windows_logfont_name;
          }
          ON_wString::ON_wString(&local_8f0,pOVar15);
          bVar5 = ON_wString::IsEmpty(&local_8f0);
          if (!bVar5) {
            memset(local_7c8,0,0x790);
            local_818 = (undefined1  [16])0x0;
            local_808 = (undefined1  [16])0x0;
            local_7f8 = (undefined1  [16])0x0;
            local_7e8 = (undefined1  [16])0x0;
            local_7d8 = (undefined1  [16])0x0;
            if (-1 < (int)local_858._12_4_) {
              local_858._8_4_ = 0;
            }
            if (-1 < (int)local_870._12_4_) {
              local_870._8_4_ = 0;
            }
            if (-1 < (int)local_888._12_4_) {
              local_888._8_4_ = 0;
            }
            if (-1 < (int)local_8a0._12_4_) {
              local_8a0._8_4_ = 0;
            }
            local_848 = (undefined1  [16])0x0;
            local_838 = (undefined1  [16])0x0;
            local_94c = 1;
            uVar9 = uVar18;
            if ((uint)uVar18 < (uint)uVar16) {
              local_94c = 1;
              uVar9 = local_8d8;
              do {
                pOVar23 = (pOVar2->m_by_quartet_name).m_a[uVar9];
                local_948 = pOVar23;
                if (pOVar23 == (ON_Font *)0x0) goto LAB_0047d925;
                pOVar15 = &pOVar23->m_loc_windows_logfont_name;
                bVar5 = ON_wString::IsNotEmpty(pOVar15);
                if (!bVar5) {
                  pOVar15 = &pOVar23->m_en_windows_logfont_name;
                }
                ON_wString::ON_wString(&local_8d0.m_quartet_name,pOVar15);
                bVar5 = ON_wString::EqualOrdinal(&local_8f0,&local_8d0.m_quartet_name,true);
                ON_wString::~ON_wString(&local_8d0.m_quartet_name);
                if (!bVar5) goto LAB_0047d925;
                uVar8 = (uint)local_948->m_managed_installed_font_and_bits & 3;
                if (uVar8 != 2) {
                  uVar8 = local_94c;
                }
                if (local_948->m_runtime_serial_number != 0) {
                  local_94c = uVar8;
                }
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
              uVar9 = uVar16 & 0xffffffff;
            }
LAB_0047d925:
            local_8e8 = (ON_Font *)CONCAT44(local_8e8._4_4_,(int)uVar9 - (uint)uVar18);
            local_930 = (ON_Font *)0x0;
            local_934 = 0;
            local_928 = (ON_Font *)((ulong)local_928 & 0xffffffff00000000);
            iVar24 = 0;
            local_91c = 0;
            local_920 = 0;
            uVar8 = 0;
            local_940 = uVar18;
            local_8f8 = uVar9;
            do {
              uVar16 = local_8d8;
              iVar17 = (int)local_8e8;
              if ((uint)local_940 < (uint)local_8f8) {
                do {
                  local_948 = (pOVar2->m_by_quartet_name).m_a[uVar16];
                  if (local_948 != (ON_Font *)0x0) {
                    if ((local_948->m_font_bUnderlined == false) &&
                       (local_948->m_font_bStrikethrough != true)) {
                      if (uVar8 == (((uint)local_948->m_managed_installed_font_and_bits & 3) == 2 &&
                                   local_948->m_runtime_serial_number != 0)) {
                        MVar1 = local_948->m_quartet_member;
                        OVar26 = Internal_StretchSlantWeightDex(10,10,local_948);
                        uVar13 = OVar26.k;
                        pOVar23 = OVar26._0_8_;
                        uVar22 = OVar26.i;
                        if ((0xfffffff6 < uVar22 - 10) && (0xfffffff6 < uVar13 - 10)) {
                          uVar18 = (ulong)pOVar23 >> 0x20;
                          uVar9 = (ulong)uVar22;
                          if (local_7c8[uVar9 * 0x16 + uVar18 * 0xb + (ulong)uVar13] == 0) {
                            local_7c8[uVar9 * 0x16 + uVar18 * 0xb + (ulong)uVar13] = (long)local_948
                            ;
                            uVar13 = uVar22;
                            if ((((int)local_928 != 0) &&
                                (uVar13 = local_934, (uint)local_930 <= uVar22)) &&
                               (pOVar23 = local_930, local_934 <= uVar22)) {
                              uVar13 = uVar22;
                            }
                            local_930 = pOVar23;
                            local_934 = uVar13;
                            *(int *)(local_818 + uVar18 * 4 + uVar9 * 8) =
                                 *(int *)(local_818 + uVar18 * 4 + uVar9 * 8) + 1;
                            if (uVar18 == 0) {
                              if (local_91c < 2) {
                                *(ON_Font **)(local_848 + (ulong)local_91c * 8) = local_948;
                              }
                              local_91c = local_91c + 1;
                            }
                            else if (OVar26.j == 1) {
                              if (local_920 < 2) {
                                *(ON_Font **)(local_838 + (ulong)local_920 * 8) = local_948;
                              }
                              local_920 = local_920 + 1;
                            }
                            local_928 = (ON_Font *)CONCAT44(local_928._4_4_,(int)local_928 + 1);
                            if (MVar1 - 1 < 4) {
                              this_00 = (ON_SimpleArray<const_ON_Font_*> *)local_878;
                              switch((uint)MVar1) {
                              case 1:
                                this_00 = (ON_SimpleArray<const_ON_Font_*> *)local_860;
                                break;
                              case 3:
                                this_00 = (ON_SimpleArray<const_ON_Font_*> *)local_890;
                                break;
                              case 4:
                                this_00 = (ON_SimpleArray<const_ON_Font_*> *)local_8a8;
                              }
                              ON_SimpleArray<const_ON_Font_*>::Append(this_00,&local_948);
                            }
                          }
                        }
                      }
                    }
                    else {
                      iVar24 = iVar24 + 1;
                    }
                  }
                  uVar16 = uVar16 + 1;
                  iVar17 = iVar17 + -1;
                } while (iVar17 != 0);
              }
              uVar18 = local_940;
              uVar8 = uVar8 + 1;
            } while (uVar8 != local_94c);
            uVar16 = local_828;
            if ((int)local_928 != 0) {
              local_908 = (undefined1  [16])0x0;
              local_918 = (undefined1  [16])0x0;
              if (((int)local_928 ==
                   local_888._8_4_ + local_8a0._8_4_ + local_870._8_4_ + local_858._8_4_) &&
                 ((uint)(local_888._8_4_ | local_8a0._8_4_ | local_870._8_4_ | local_858._8_4_) < 2)
                 ) {
                if (local_858._8_4_ == 1) {
                  local_918._0_8_ = *(undefined8 *)local_858._0_8_;
                }
                else {
                  local_918._0_8_ = (ON_Font *)0x0;
                }
                if (local_870._8_4_ == 1) {
                  local_918._8_8_ = *(undefined8 *)local_870._0_8_;
                }
                else {
                  local_918._8_8_ = (ON_Font *)0x0;
                }
                if (local_888._8_4_ == 1) {
                  local_908._0_8_ = *(undefined8 *)local_888._0_8_;
                }
                else {
                  local_908._0_8_ = (ON_Font *)0x0;
                }
                if (local_8a0._8_4_ == 1) {
                  local_908._8_8_ = *(undefined8 *)local_8a0._0_8_;
                }
                else {
                  local_908._8_8_ = (ON_Font *)0x0;
                }
                pOVar7 = (ON_Font *)local_918._0_8_;
                local_930 = (ON_Font *)local_908._0_8_;
                pOVar23 = (ON_Font *)local_918._8_8_;
              }
              else {
                uVar8 = (uint)local_930;
                if (((local_91c < 3) &&
                    (((int)local_928 == local_91c + local_920 && (local_920 < 3)))) &&
                   (uVar8 == local_934)) {
                  local_908 = local_838;
                  local_918 = local_848;
                  pOVar7 = (ON_Font *)local_848._0_8_;
                  local_930 = (ON_Font *)local_838._0_8_;
                  pOVar23 = (ON_Font *)local_848._8_8_;
                }
                else {
                  if (uVar8 < local_934) {
                    uVar9 = 5;
                    uVar6 = 4;
                    uVar10 = 6;
                    do {
                      uVar14 = uVar6 & 0xffffffff;
                      if ((uint)(*(int *)(local_818 + uVar6 * 8 + 4) +
                                *(int *)(local_818 + uVar6 * 8)) <=
                          (uint)(*(int *)(local_818 + uVar9 * 8 + 4) +
                                *(int *)(local_818 + uVar9 * 8))) {
                        uVar14 = uVar9;
                      }
                      uVar9 = uVar10 & 0xffffffff;
                      if ((uint)(*(int *)(local_818 + uVar10 * 8 + 4) +
                                *(int *)(local_818 + uVar10 * 8)) <=
                          (uint)(*(int *)(local_818 + uVar14 * 8 + 4) +
                                *(int *)(local_818 + uVar14 * 8))) {
                        uVar9 = uVar14;
                      }
                      uVar8 = (uint)uVar9;
                      uVar10 = uVar10 + 1;
                      uVar6 = uVar6 - 1;
                    } while (uVar6 != 0);
                  }
                  if ((uVar8 - 10 < 0xfffffff7) ||
                     (uVar9 = (ulong)uVar8,
                     *(int *)(local_818 + uVar9 * 8) + *(int *)(local_818 + uVar9 * 8 + 4) == 0))
                  goto LAB_0047e2ac;
                  plVar19 = (long *)local_918;
                  lVar11 = 0;
                  bVar5 = true;
                  do {
                    bVar12 = bVar5;
                    if (*(uint *)(local_818 + lVar11 * 4 + uVar9 * 8) < 3) {
                      iVar17 = 0;
                      uVar16 = 1;
                      do {
                        if (local_7c8[uVar9 * 0x16 + lVar11 * 0xb + uVar16] != 0) {
                          lVar21 = (long)iVar17;
                          iVar17 = iVar17 + 1;
                          *(long *)(local_918 + lVar21 * 8 + lVar11 * 0x10) =
                               local_7c8[uVar9 * 0x16 + lVar11 * 0xb + uVar16];
                        }
                      } while ((uVar16 < 9) && (uVar16 = uVar16 + 1, iVar17 < 2));
                    }
                    else {
                      uVar16 = (ulong)((alStack_7a8[uVar9 * 0x16 + lVar11 * 0xb] == 0) + 4);
                      uVar8 = (alStack_7a8[uVar9 * 0x16 + lVar11 * 0xb] == 0) + 3;
                      do {
                        uVar22 = uVar8;
                        uVar6 = uVar16;
                        uVar13 = (uint)uVar6;
                        lVar21 = local_7c8[uVar9 * 0x16 + lVar11 * 0xb + (uVar6 & 0xffffffff)];
                        if (uVar13 == 0) break;
                        uVar16 = uVar6 - 1;
                        uVar8 = uVar22 - 1;
                      } while (lVar21 == 0);
                      uVar16 = uVar6 + 1;
                      if (alStack_7a8[uVar9 * 0x16 + lVar11 * 0xb + 3] != 0) {
                        uVar16 = 7;
                      }
                      uVar10 = (ulong)((int)uVar16 - 1);
                      do {
                        uVar14 = uVar10;
                        lVar3 = local_7c8[uVar9 * 0x16 + lVar11 * 0xb + uVar16];
                        uVar10 = (ulong)((int)uVar14 + 1);
                        if (9 < uVar16) break;
                        uVar16 = uVar16 + 1;
                      } while (lVar3 == 0);
                      uVar8 = uVar13;
                      if ((lVar21 == 0) || (lVar3 != 0)) {
                        if ((lVar21 == 0) && (lVar3 != 0)) {
                          do {
                            uVar22 = (uint)uVar14;
                            uVar8 = uVar13;
                            if (uVar22 == 0) break;
                            lVar21 = lVar11 * 0xb + uVar14;
                            uVar14 = (ulong)(uVar22 - 1);
                            uVar8 = uVar22;
                          } while (local_7c8[uVar9 * 0x16 + lVar21] == 0);
                        }
                      }
                      else if (uVar13 == 0) {
                        uVar8 = 0;
                      }
                      else {
                        do {
                          uVar13 = uVar22;
                          if (uVar13 == 0) goto LAB_0047ddcf;
                          uVar22 = uVar13 - 1;
                        } while (local_7c8[uVar9 * 0x16 + lVar11 * 0xb + (ulong)uVar13] == 0);
                        uVar10 = uVar6 & 0xffffffff;
                        uVar8 = uVar13;
                      }
LAB_0047ddcf:
                      *plVar19 = local_7c8[uVar9 * 0x16 + lVar11 * 0xb + (ulong)uVar8];
                      plVar19[1] = local_7c8[uVar9 * 0x16 + lVar11 * 0xb + uVar10];
                    }
                    lVar11 = 1;
                    plVar19 = (long *)local_908;
                    bVar5 = false;
                  } while (bVar12);
                  pOVar7 = (ON_Font *)local_918._0_8_;
                  local_930 = (ON_Font *)local_908._0_8_;
                  pOVar23 = (ON_Font *)local_918._8_8_;
                }
              }
              if (pOVar7 == (ON_Font *)0x0 && pOVar23 == (ON_Font *)0x0) {
                pOVar23 = (ON_Font *)local_908._8_8_;
                local_918._8_8_ = local_908._8_8_;
                local_918._0_8_ = local_930;
                local_908 = (undefined1  [16])0x0;
                pOVar7 = local_930;
                local_930 = (ON_Font *)0x0;
              }
              local_928 = pOVar23;
              if (pOVar7 == (ON_Font *)0x0 && local_930 == (ON_Font *)0x0) {
                local_930 = (ON_Font *)local_908._8_8_;
                local_918._8_8_ = 0;
                local_918._0_8_ = pOVar23;
                local_908._8_8_ = 0;
                local_908._0_8_ = local_930;
                local_928 = (ON_Font *)0x0;
                pOVar7 = pOVar23;
              }
              lVar11 = 0;
              bVar5 = true;
              do {
                bVar12 = bVar5;
                lVar21 = 0;
                bVar5 = true;
                do {
                  bVar20 = bVar5;
                  lVar3 = *(long *)(local_918 + lVar21 * 8 + lVar11 * 0x10);
                  if (lVar3 != 0) {
                    if ((*(char *)(lVar3 + 0x91) == '\0') ||
                       ((*(char *)(lVar3 + 0x91) != (&DAT_006ba1cc)[lVar21 + lVar11 * 2] &&
                        (*(char *)(lVar3 + 0x1f) != '\x02')))) {
                      *(undefined1 *)(lVar3 + 0x91) = (&DAT_006ba1cc)[lVar21 + lVar11 * 2];
                    }
                  }
                  lVar21 = 1;
                  bVar5 = false;
                } while (bVar20);
                lVar11 = 1;
                bVar5 = false;
              } while (bVar12);
              if ((uint)local_940 < (uint)local_8f8) {
                ppOVar4 = (pOVar2->m_by_quartet_name).m_a;
                uVar16 = local_8d8;
                do {
                  pOVar23 = ppOVar4[uVar16];
                  if (((((pOVar23 != (ON_Font *)0x0) && (pOVar23 != pOVar7)) &&
                       (pOVar23 != local_928)) &&
                      ((pOVar23 != local_930 && (pOVar23 != (ON_Font *)local_908._8_8_)))) &&
                     (((pOVar23->m_font_bUnderlined == false &&
                       ((pOVar23->m_font_bStrikethrough == false &&
                        (pOVar23->m_quartet_member != Unset)))) &&
                      (pOVar23->m_font_type == InstalledFont)))) {
                    pOVar23->m_quartet_member = Unset;
                  }
                  uVar16 = uVar16 + 1;
                } while ((local_8f8 & 0xffffffff) != uVar16);
                if ((iVar24 != 0) && (uVar16 = local_8d8, (uint)local_940 < (uint)local_8f8)) {
                  do {
                    local_948 = (pOVar2->m_by_quartet_name).m_a[uVar16];
                    if ((local_948 != (ON_Font *)0x0) &&
                       ((local_948->m_font_bUnderlined != false ||
                        (local_948->m_font_bStrikethrough == true)))) {
                      OVar26 = Internal_StretchSlantWeightDex(10,10,local_948);
                      if (((OVar26.k - 1 < 9 && OVar26.i - 1 < 9) && OVar26._0_8_ >> 0x21 == 0) &&
                         (local_7c8[(ulong)OVar26.i * 0x16 + (ulong)OVar26.k * 0xc] != 0)) {
                        local_948->m_quartet_member =
                             *(Member *)
                              (local_7c8[(ulong)OVar26.i * 0x16 + (ulong)OVar26.k * 0xc] + 0x91);
                      }
                    }
                    uVar16 = uVar16 + 1;
                    iVar24 = (int)local_8e8 + -1;
                    local_8e8 = (ON_Font *)CONCAT44(local_8e8._4_4_,iVar24);
                  } while (iVar24 != 0);
                }
              }
              lVar11 = 0;
              local_8e8 = pOVar7;
              bVar5 = true;
              do {
                bVar12 = bVar5;
                lVar21 = lVar11 * 0x10;
                lVar11 = 0;
                bVar5 = true;
                do {
                  bVar20 = bVar5;
                  local_948 = *(ON_Font **)(local_918 + lVar11 * 8 + lVar21);
                  if (((((local_948 != (ON_Font *)0x0) && (local_948->m_font_type != InstalledFont))
                       && (((uint)local_948->m_managed_installed_font_and_bits & 3) != 2 &&
                           local_948->m_runtime_serial_number != 0)) &&
                      (((local_948->m_font_bUnderlined == false &&
                        (local_948->m_font_bStrikethrough == false)) &&
                       (pOVar23 = (ON_Font *)
                                  (local_948->m_managed_installed_font_and_bits & 0xfffffffffffffffc
                                  ), pOVar23 != (ON_Font *)0x0)))) &&
                     ((pOVar23->m_font_type == InstalledFont ||
                      (((pOVar23->m_font_type == ManagedFont &&
                        (pOVar23->m_runtime_serial_number != 0)) &&
                       (((uint)pOVar23->m_managed_installed_font_and_bits & 3) == 1)))))) {
                    pOVar15 = &pOVar23->m_loc_windows_logfont_name;
                    bVar5 = ON_wString::IsNotEmpty(pOVar15);
                    if (!bVar5) {
                      pOVar15 = &pOVar23->m_en_windows_logfont_name;
                    }
                    ON_wString::ON_wString(&local_8d0.m_quartet_name,pOVar15);
                    bVar5 = ON_wString::EqualOrdinal(&local_8f0,&local_8d0.m_quartet_name,true);
                    ON_wString::~ON_wString(&local_8d0.m_quartet_name);
                    uVar18 = local_940;
                    if (bVar5) {
                      ON_Font::InstalledFontQuartet(&local_8d0,pOVar23);
                      ON_wString::ON_wString(&local_820,&local_8d0.m_quartet_name);
                      bVar5 = ON_wString::EqualOrdinal(&local_8f0,&local_820,true);
                      ON_wString::~ON_wString(&local_820);
                      uVar18 = local_940;
                      if (bVar5) {
                        pOVar23 = (ON_Font *)
                                  CONCAT44(local_8d0.m_regular._4_4_,(int)local_8d0.m_regular);
                        if (pOVar23 != (ON_Font *)0x0) {
                          local_918._0_8_ = pOVar23;
                          local_8e8 = pOVar23;
                        }
                        pOVar23 = (ON_Font *)CONCAT44(local_8d0.m_bold._4_4_,(int)local_8d0.m_bold);
                        if (pOVar23 != (ON_Font *)0x0) {
                          local_918._8_8_ = pOVar23;
                          local_928 = pOVar23;
                        }
                        pOVar23 = (ON_Font *)
                                  CONCAT44(local_8d0.m_italic._4_4_,(int)local_8d0.m_italic);
                        if (pOVar23 != (ON_Font *)0x0) {
                          local_908._0_8_ = pOVar23;
                          local_930 = pOVar23;
                        }
                        if (CONCAT44(local_8d0.m_bold_italic._4_4_,(int)local_8d0.m_bold_italic) !=
                            0) {
                          local_908._8_8_ =
                               CONCAT44(local_8d0.m_bold_italic._4_4_,(int)local_8d0.m_bold_italic);
                        }
                      }
                      ON_wString::~ON_wString(&local_8d0.m_quartet_name);
                    }
                  }
                  lVar11 = 1;
                  bVar5 = false;
                } while (bVar20);
                bVar5 = false;
              } while (bVar12);
              quartet_name_00 = ON_wString::operator_cast_to_wchar_t_(&local_8f0);
              ON_FontFaceQuartet::ON_FontFaceQuartet
                        (&local_8d0,quartet_name_00,local_8e8,local_928,local_930,
                         (ON_Font *)local_908._8_8_);
              auVar25._0_4_ = -(uint)((int)local_8d0.m_italic == 0 && (int)local_8d0.m_regular == 0)
              ;
              auVar25._4_4_ =
                   -(uint)(local_8d0.m_italic._4_4_ == 0 && local_8d0.m_regular._4_4_ == 0);
              auVar25._8_4_ =
                   -(uint)((int)local_8d0.m_bold_italic == 0 && (int)local_8d0.m_bold == 0);
              auVar25._12_4_ =
                   -(uint)(local_8d0.m_bold_italic._4_4_ == 0 && local_8d0.m_bold._4_4_ == 0);
              iVar24 = movmskps(extraout_EAX,auVar25);
              if (iVar24 != 0xf) {
                ON_ClassArray<ON_FontFaceQuartet>::Append(local_8e0,&local_8d0);
              }
              ON_wString::~ON_wString(&local_8d0.m_quartet_name);
              uVar16 = local_828;
            }
          }
LAB_0047e2ac:
          ON_wString::~ON_wString(&local_8f0);
        }
        uVar8 = (uint)uVar18 + 1;
        if ((uint)uVar18 < (uint)local_8f8) {
          uVar8 = (uint)local_8f8;
        }
        uVar18 = (ulong)uVar8;
      } while (uVar8 < (uint)uVar16);
    }
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)local_8a8);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)local_890);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)local_878);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray((ON_SimpleArray<const_ON_Font_*> *)local_860);
  }
  return local_8e0;
}

Assistant:

const ON_ClassArray< ON_FontFaceQuartet >& ON_FontList::QuartetList() const
{
  // call ByQuartetName() first to insure m_quartet_list[] is set correctly.
  const ON_SimpleArray<const ON_Font*>& a = this->ByQuartetName();
  
  if (m_quartet_list.Count() > 0)
    return m_quartet_list;

  const unsigned int font_count = a.UnsignedCount();
  m_quartet_list.Reserve(32 + font_count / 4);

  const ON_Font* f = nullptr;
  const unsigned max_stretch_dex = 10;
  const unsigned max_weight_dex = 10;

  // fonts_by_ssw[stretch_dex][upright,italic][weight_dex]
  // = all fonts with the same quartet name arranged by stretch, slant, and weight.
  const ON_Font* fonts_by_ssw[11][2][11] = {};

  // weight_count[stretch_dex][upright,italic] = number of weights available for that stretch and slant
  unsigned int weight_count[10][2] = {};

  // stretch values range from min stretch = stretch_dex_range[0] to max stretch = stretch_dex_range[1].
  unsigned stretch_dex_range[2] = { 0U,0U };

  // Fonts with stretch < medium_stretch_dex are "compressed"
  // Fonts with stretch > medium_stretch_dex are "expanded"
  // When we have multiple candidates to choose from, we opt for ones closest to medium.
  const unsigned medium_stretch_dex = (unsigned)static_cast<unsigned char>(ON_Font::Stretch::Medium);

  ON_SimpleArray<const ON_Font*> regular_faces(8);
  ON_SimpleArray<const ON_Font*> bold_faces(8);
  ON_SimpleArray<const ON_Font*> italic_faces(8);
  ON_SimpleArray<const ON_Font*> bolditalic_faces(8);

  unsigned next_i = 0U;
  for (unsigned i = 0; i < font_count; i = (i < next_i) ? next_i : (i+1))
  {
    f = a[i];
    if (nullptr == f)
      continue;

    const ON_wString quartet_name = f->QuartetName();
    if (quartet_name.IsEmpty())
      continue;

    // fonts_by_ssw_count = total number of undecorated fonts with the same QuartetName()
    unsigned fonts_by_ssw_count = 0;

    // total number of fonts with underline or striketrough rendering effects enabled.
    unsigned decorated_fonts_count = 0;

    // fonts_by_ssw[][][] = all the "clean" fonts with the same quartet name sorted by stretch-slant-weight
    memset(fonts_by_ssw, 0, sizeof(fonts_by_ssw));
    memset(weight_count, 0, sizeof(weight_count));
    memset(stretch_dex_range, 0, sizeof(stretch_dex_range));
    regular_faces.SetCount(0);
    bold_faces.SetCount(0);
    italic_faces.SetCount(0);
    bolditalic_faces.SetCount(0);

    unsigned int upright_face_count = 0;
    unsigned int slanted_face_count = 0;
    const ON_Font* upright_faces[2] = {}; // room to save up to 2 upright faces
    const ON_Font* slanted_faces[2] = {}; // room to save up to 2 slanted faces

    // This for() loop sets the array limits for the fonts with the same quartet name
    // and determines how many passes are needed (substitutes are ignored in favor of
    // non substitutes).
    unsigned pass_count = 1;
    for (next_i = i; next_i < font_count; ++next_i)
    {
      f = a[next_i];
      if (nullptr == f)
        break;
      if (false == quartet_name.EqualOrdinal(f->QuartetName(), true))
        break; // f has a different quartet name - we're done getting the fonts in this quartet
      if (f->IsManagedSubstitutedFont())
        pass_count = 2;
    }
    
    // This for() loop gets all the fonts with the same QuartetName() and puts them in fonts_by_ssw[][][]. 
    // While doing that it get ranges of values stretch, counts the number of fonts that have each weight, ...
    for ( unsigned pass = 0; pass < pass_count; ++pass) for ( unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
      {
        // these are rendering effects and we should have a "clean" version in this list too
        ++decorated_fonts_count;
        continue; 
      }
      if (pass != (f->IsManagedSubstitutedFont() ? 1U : 0U))
        continue;

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;

      // use f's stretch-slant-weight to add it to the fonts_by_ssw[][][] array.
      const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);

      const unsigned stretch_dex = ssw_dex.i;
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      const unsigned slant_dex = ssw_dex.j;

      const unsigned weight_dex = ssw_dex.k;
      if (weight_dex < 1 || weight_dex >= max_weight_dex)
        continue;

      if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][weight_dex])
      {
        // We already found one font with he same quartet name, stretch, slant, and weight.
        // The first one wins and that's why we use two passes when substitute fonts are involved.
        continue;
      }

      ++fonts_by_ssw_count;
      fonts_by_ssw[stretch_dex][slant_dex][weight_dex] = f;

      // add this font's stretch, weight, and slant to the tally for this quartet name.
      if (1 == fonts_by_ssw_count)
      {
        stretch_dex_range[0] = stretch_dex;
        stretch_dex_range[1] = stretch_dex;
      }
      else if (stretch_dex < stretch_dex_range[0])
        stretch_dex_range[0] = stretch_dex;
      else if (stretch_dex > stretch_dex_range[1])
        stretch_dex_range[1] = stretch_dex;

      ++weight_count[stretch_dex][slant_dex];

      if (0 == slant_dex)
      {
        if (upright_face_count < 2)
          upright_faces[upright_face_count] = f;
        ++upright_face_count;
      }
      else if (1 == slant_dex)
      {
        if (slanted_face_count < 2)
          slanted_faces[slanted_face_count] = f;
        ++slanted_face_count;
      }

      // if f's role in the quartet is known, add it to the appropriate x_faces[] array.
      switch (fm)
      {
      case ON_FontFaceQuartet::Member::Regular:
        regular_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Bold:
        bold_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Italic:
        italic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::BoldItalic:
        bolditalic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Unset:
        break;
      };
    }

    // fonts_by_ssw_count = number of usable fonts with the same quartet name.
    // Pointers to these fonts are someplace in the fonts_by_ssw[][][] array.
    if (0 == fonts_by_ssw_count)
      continue; // nothing usable

    // The goal is to look at the fonts in fonts_by_ssw[][][] and select
    // the best choice for a rich text quartet (which may have 1 to 4 faces).
    const ON_Font* quartet_faces[2][2] = {};
    bool bHaveQuartetFaces = false;

    const unsigned regular_count = regular_faces.UnsignedCount();
    const unsigned bold_count = bold_faces.UnsignedCount();
    const unsigned italic_count = italic_faces.UnsignedCount();
    const unsigned bolditalic_count = bolditalic_faces.UnsignedCount();
    if (
      fonts_by_ssw_count == (regular_count + bold_count + italic_count + bolditalic_count)
      && regular_count <= 1 && bold_count <= 1 && italic_count <= 1 && bolditalic_count <= 1)
    {
      // Best case - every font with this quartet name knows the role it plays in the quartet and there are no contradictions.
      quartet_faces[0][0] = 1 == regular_count ? regular_faces[0] : nullptr;
      quartet_faces[0][1] = 1 == bold_count ? bold_faces[0] : nullptr;
      quartet_faces[1][0] = 1 == italic_count ? italic_faces[0] : nullptr;
      quartet_faces[1][1] = 1 == bolditalic_count ? bolditalic_faces[0] : nullptr;
      bHaveQuartetFaces = true;
    }
    else if (fonts_by_ssw_count == upright_face_count + slanted_face_count
      && upright_face_count <= 2
      && slanted_face_count <= 2
      && stretch_dex_range[0] == stretch_dex_range[1]
      )
    {
      if (2 == upright_face_count && ON_Font::CompareWeight(upright_faces[0]->FontWeight(), upright_faces[1]->FontWeight()) > 0)
      {
        f = upright_faces[0];
        upright_faces[0] = upright_faces[1];
        upright_faces[1] = f;
      }
      if (2 == slanted_face_count && ON_Font::CompareWeight(slanted_faces[0]->FontWeight(), slanted_faces[1]->FontWeight()) > 0)
      {
        f = slanted_faces[0];
        slanted_faces[0] = slanted_faces[1];
        slanted_faces[1] = f;
      }
      quartet_faces[0][0] = upright_faces[0];
      quartet_faces[0][1] = upright_faces[1];
      quartet_faces[1][0] = slanted_faces[0];
      quartet_faces[1][1] = slanted_faces[1];
      bHaveQuartetFaces = true;
    }

    if (false == bHaveQuartetFaces)
    {
      // 1. Most Windows installed fonts have the Windows LOGFONT name reliably set
      // from Windows LOGFONT information when we create installed ON_Fonts from 
      // DirectWrite fonts in opennurbs_win_dwrite.cpp. The Windows LOGFONTs partition
      // families into quartets. These end up with bUsePairCandidate = true.
      // 
      // 2. In rare cases on Windows, font foundaries or authors fail to specify a LOGFONT name
      // in the ttc / ttf / postscript / ... file. 
      // If we are able to make a reasonable guess, then we set the member here.
      // 
      // 3. Apple installed fonts are created from CTFont in opennurbs_apple_nsfont.cpp
      // and the LOGFONT information from ttc / ttf / postscript files cannot be retrieved.
      // There are no Mac OS tools that reliably paritition large font families into
      // quartets.
      // 
      // 4. Missing fonts that are created in ON_Font::FontFromRichTextProperties() have the quartet
      // member set to the specified rich text regular/bold/italic/bold-italic property.
      //
      // Attempt to find something usable in this mess ...

      unsigned stretch_dex = medium_stretch_dex;
      if (stretch_dex_range[0] < stretch_dex_range[1])
      {
        // Need to pick the stretch_dex with the most members.
        // This happens on Mac OS (where no reliable "LOGFONT" name exists) and
        // with damaged Windows fonts that don't have a "LOFGONT" name set.
        // Pick the one closest to ON_Font::Stretch::Medium with the most faces        
        for (unsigned k = 1; k <= medium_stretch_dex; ++k)
        {
          const unsigned k0 = medium_stretch_dex - k;
          const unsigned k1 = medium_stretch_dex + k;
          if (k0 > 0 && (weight_count[k0][0] + weight_count[k0][1]) > (weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k0;
          if (k1 < max_stretch_dex && (weight_count[k1][0] + weight_count[k1][1]) >(weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k1;
        }
      }
      else
      {
        stretch_dex = stretch_dex_range[0];
      }
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      if (weight_count[stretch_dex][0] + weight_count[stretch_dex][1] <= 0)
        continue;

      const unsigned normal_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Normal);
      const unsigned medium_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Medium);
      const unsigned bold_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Bold);

      for (unsigned slant_dex = 0; slant_dex < 2; slant_dex++)
      {
        if (weight_count[stretch_dex][slant_dex] <= 2)
        {
          // 0, 1 or 2 available weights.
          // If there is 1 face it must be the "Regular" face.
          // If there are 2 faces, the lightest will be "Regular" and the heaviest will be bold.
          int pair_dex = 0;
          for (int j = 1; j < max_weight_dex && pair_dex < 2; ++j)
          {
            if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][j])
              quartet_faces[slant_dex][pair_dex++] = fonts_by_ssw[stretch_dex][slant_dex][j];
          }
          continue;
        }

        // 3 or more available weights (Bahnshrift, Helvetica Neue, ...)
        unsigned regular_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][normal_weight_dex])
          ? normal_weight_dex
          : medium_weight_dex;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && regular_dex > 0)
          --regular_dex;

        unsigned bold_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_weight_dex])
          ? bold_weight_dex
          : regular_dex + 1;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex] && bold_dex < max_weight_dex)
          ++bold_dex;

        if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (regular_dex > 0)
          {
            for (unsigned j = regular_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              bold_dex = regular_dex;
              regular_dex = j;
              break;
            }
          }
        }
        else if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (bold_dex > 0)
          {
            for (unsigned j = bold_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              regular_dex = j;
              break;
            }
          }
        }

        quartet_faces[slant_dex][0] = fonts_by_ssw[stretch_dex][slant_dex][regular_dex];
        quartet_faces[slant_dex][1] = fonts_by_ssw[stretch_dex][slant_dex][bold_dex];
      }
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[0][1])
    {
      // Fonts like Monotype Corsiva have only slanted faces.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and bold member in this situation.
      quartet_faces[0][0] = quartet_faces[1][0];
      quartet_faces[0][1] = quartet_faces[1][1];
      quartet_faces[1][0] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[1][0])
    {
      // This might happen if buggy code encounters a heavy font like Arial Black
      // and incorrectly specifies the heavy regular/italic faces as bold.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and italic member in this situation.
      quartet_faces[0][0] = quartet_faces[0][1];
      quartet_faces[1][0] = quartet_faces[1][1];
      quartet_faces[0][1] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    // If ON_Font.m_quartet_member is not set or set incorrectly, 
    // then set it now so we get consistent answers going forward.
    // (Managed quartets are recomputed as new missing fonts are added and in complex cases, the quartet member can change).
    // Installed font quartet members are set once and never change.
    const ON_FontFaceQuartet::Member member[2][2] = {
      {ON_FontFaceQuartet::Member::Regular,ON_FontFaceQuartet::Member::Bold},
      {ON_FontFaceQuartet::Member::Italic,ON_FontFaceQuartet::Member::BoldItalic}
    };
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr != f)
      {
        const ON_FontFaceQuartet::Member m = f->m_quartet_member;
        if (ON_FontFaceQuartet::Member::Unset == m)
          f->m_quartet_member = member[ii][jj];
        else if (m != member[ii][jj])
        {
          if (ON_Font::FontType::InstalledFont != f->m_font_type)
            quartet_faces[ii][jj]->m_quartet_member = member[ii][jj];
        }
      }
    }

    // Unset the m_quartet_member on unsed fonts with this quartet name.
    for (unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f == quartet_faces[0][0] || f == quartet_faces[0][1] || f == quartet_faces[1][0] || f == quartet_faces[1][1])
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // dealt with below

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;
      if (ON_FontFaceQuartet::Member::Unset == fm)
        continue;
      if (ON_Font::FontType::InstalledFont != f->m_font_type)
        continue;

      // m_quartet_member incorrectly set. 
      // If you are debugging and this is causing a problem, the bug is not here; 
      // it is in the code above that fills in quartet_faces[][].
      f->m_quartet_member = ON_FontFaceQuartet::Member::Unset;
    }

    if (decorated_fonts_count > 0)
    {
      // This for() loop copies the clean font quartet settings to decorated  (underlined and strikethrough) fonts
      for (unsigned j = i; j < next_i; ++j)
      {
        f = a[j];
        if (nullptr == f)
          continue;
        if (false == f->IsUnderlined() && false == f->IsStrikethrough())
          continue;

        // f is underlined or strikethrough - find the clean version in fonts_by_ssw[][][]
        const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);
        const ON_Font* cleanf = (
          ssw_dex.i >= 1 && ssw_dex.i < max_stretch_dex
          && ssw_dex.j >= 0 && ssw_dex.j < 2
          && ssw_dex.k >= 1 && ssw_dex.k < max_weight_dex
          )
          ? fonts_by_ssw[ssw_dex.i][ssw_dex.k][ssw_dex.k]
          : nullptr;
        if (nullptr != cleanf)
        {
          const ON_FontFaceQuartet::Member fm = cleanf->m_quartet_member;
          f->m_quartet_member = fm;
        }
      }
    }

    // Now convert managed to installed when that makes sense.
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr == f)
        continue;
      if (ON_Font::FontType::InstalledFont == f->m_font_type)
        continue;
      if (f->IsManagedSubstitutedFont())
        continue; // common - f is a managed font that is missing from this device.

      if (false == f->IsManagedFont())
        continue; // troubling situation ...
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // troubling situation ... 

      // There are 2 lists of fonts.
      // All installed fonts - this list is made once when an application starts.
      // Managed fonts - this list grows as an application needs fonts
      // and is used to handle missing fonts and fonts with effects like underlined and strikethrough.
      // 
      // This is a case where a managed font, like ON_Font::Default, 
      // the default engraving font, 
      // and more complicated cases that arise is rich text parsing, 
      // has an identical font that is installed.
      const ON_Font* installed_font = f->Internal_ManagedFontToInstalledFont();
      if (nullptr == installed_font)
        continue;
      if (false == installed_font->IsInstalledFont())
        continue; // bad mojo happened sometime earlier in the life of this app instance.
      if (false == quartet_name.EqualOrdinal(installed_font->QuartetName(), true))
        continue; // troubling situation ...

      // It is often the case that the installed quartet has faces not in the managed font list.
      // ON_Font::Default is a good example. 
      // If there 
      ON_FontFaceQuartet installed_font_quartet = installed_font->InstalledFontQuartet();
      if (false == quartet_name.EqualOrdinal(installed_font_quartet.QuartetName(), true))
        continue;

      if (installed_font_quartet.HasRegularFace())
        quartet_faces[0][0] = installed_font_quartet.RegularFace();
      if (installed_font_quartet.HasBoldFace())
        quartet_faces[0][1] = installed_font_quartet.BoldFace();
      if (installed_font_quartet.HasItalicFace())
        quartet_faces[1][0] = installed_font_quartet.ItalicFace();
      if (installed_font_quartet.HasBoldItalicFace())
        quartet_faces[1][1] = installed_font_quartet.BoldItalicFace();
    }

    const ON_FontFaceQuartet q(quartet_name, quartet_faces[0][0], quartet_faces[0][1], quartet_faces[1][0], quartet_faces[1][1]);
    if (q.IsEmpty())
      continue;

    m_quartet_list.Append(q);
  }

  return m_quartet_list;
}